

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

void __thiscall icu_63::Formattable::Formattable(Formattable *this,int64_t value)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003c7878;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003d8fe8;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  init(this,(EVP_PKEY_CTX *)value);
  this->fType = kInt64;
  (this->fValue).fInt64 = value;
  return;
}

Assistant:

Formattable::Formattable(int64_t value)
{
    init();
    fType = kInt64;
    fValue.fInt64 = value;
}